

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

glyph_t __thiscall QFontEngine::findGlyph(QFontEngine *this,QLatin1StringView name)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  bool bVar1;
  glyph_t gVar2;
  uint uVar3;
  QFontEngine *in_RDI;
  long in_FS_OFFSET;
  uint ucs4;
  glyph_t result;
  bool ok_1;
  bool ok;
  QLatin1StringView uni;
  QLatin1StringView gid;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QFontEngine *pQVar4;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar5;
  QLatin1String local_48;
  QLatin1String local_38 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  gVar2 = queryHarfbuzz<QFontEngine::findGlyph(QLatin1String)const::__0>
                    (in_RDI,(anon_class_16_1_898f2789 *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (gVar2 == 0) {
    local_38[0].m_size = 3;
    local_38[0].m_data = "gid";
    local_48.m_size = 3;
    local_48.m_data = "uni";
    s.m_data._0_4_ = in_stack_ffffffffffffff88;
    s.m_size = (qsizetype)pQVar4;
    s.m_data._4_4_ = in_stack_ffffffffffffff8c;
    bVar1 = QLatin1String::startsWith
                      ((QLatin1String *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),s,
                       CaseInsensitive);
    if (bVar1) {
      QLatin1String::size(local_38);
      QLatin1String::slice
                ((QLatin1String *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      gVar2 = QLatin1String::toUInt
                        ((QLatin1String *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (bool *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c);
    }
    else {
      s_00.m_data._0_4_ = in_stack_ffffffffffffff88;
      s_00.m_size = (qsizetype)pQVar4;
      s_00.m_data._4_4_ = in_stack_ffffffffffffff8c;
      bVar1 = QLatin1String::startsWith
                        ((QLatin1String *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),s_00,
                         CaseInsensitive);
      if (bVar1) {
        uVar5 = 0;
        QLatin1String::size(&local_48);
        QLatin1String::slice
                  ((QLatin1String *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        uVar3 = QLatin1String::toUInt
                          ((QLatin1String *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           (bool *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c);
        if (((uVar5 & 0x1000000) != 0) &&
           (gVar2 = (*in_RDI->_vptr_QFontEngine[0xb])(in_RDI,(ulong)uVar3), gVar2 != 0)) {
          (*in_RDI->_vptr_QFontEngine[0x2c])();
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return gVar2;
  }
  __stack_chk_fail();
}

Assistant:

glyph_t QFontEngine::findGlyph(QLatin1StringView name) const
{
    glyph_t result = 0;

#if QT_CONFIG(harfbuzz)
    result = queryHarfbuzz(this, [name](hb_font_t *hbFont){
        // glyph names are all ASCII, so latin1 is fine here.
        hb_codepoint_t glyph;
        if (hb_font_get_glyph_from_name(hbFont, name.constData(), name.size(), &glyph))
            return glyph_t(glyph);
        return glyph_t(0);
    });
#else // if we are here, no point in trying again if we already tried harfbuzz
    if (!result) {
        for (glyph_t index = 0; index < uint(glyphCount()); ++index) {
            if (name == glyphName(index))
                return index;
        }
    }
#endif

    if (!result) {
        constexpr auto gid = "gid"_L1;
        constexpr auto uni = "uni"_L1;
        if (name.startsWith(gid)) {
            bool ok;
            result = name.slice(gid.size()).toUInt(&ok);
            if (ok && result < glyph_t(glyphCount()))
                return result;
        } else if (name.startsWith(uni)) {
            bool ok;
            const uint ucs4 = name.slice(uni.size()).toUInt(&ok, 16);
            if (ok) {
                result = glyphIndex(ucs4);
                if (result > 0 && result < glyph_t(glyphCount()))
                    return result;
            }
        }
    }

    return result;
}